

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

int32 feat_s2mfc2feat(feat_t *fcb,char *file,char *dir,char *cepext,int32 sf,int32 ef,mfcc_t ***feat
                     ,int32 maxfr)

{
  int iVar1;
  size_t sVar2;
  mfcc_t **local_70;
  mfcc_t **mfc;
  size_t path_length;
  size_t cepext_length;
  size_t file_length;
  int32 nfr;
  int32 win;
  char *ps;
  char *path;
  int32 ef_local;
  int32 sf_local;
  char *cepext_local;
  char *dir_local;
  char *file_local;
  feat_t *fcb_local;
  
  _nfr = "/";
  mfc = (mfcc_t **)0x0;
  path._0_4_ = ef;
  path._4_4_ = sf;
  _ef_local = cepext;
  cepext_local = dir;
  dir_local = file;
  file_local = (char *)fcb;
  if (fcb->cepsize < 1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
            ,0x49c,"Bad cepsize: %d\n",(ulong)(uint)fcb->cepsize);
    fcb_local._4_4_ = -1;
  }
  else {
    if (cepext == (char *)0x0) {
      _ef_local = "";
    }
    if (dir == (char *)0x0) {
      cepext_local = "";
      _nfr = "";
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
              ,0x4b3,"At directory . (current directory)\n");
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
              ,0x4b6,"At directory %s\n",dir);
      sVar2 = strlen(cepext_local);
      mfc = (mfcc_t **)(sVar2 + 1 + (long)mfc);
    }
    cepext_length = strlen(dir_local);
    path_length = strlen(_ef_local);
    if ((path_length < cepext_length) &&
       (iVar1 = strcmp(dir_local + (cepext_length - path_length),_ef_local), iVar1 == 0)) {
      _ef_local = "";
      path_length = 0;
    }
    mfc = (mfcc_t **)(cepext_length + path_length + 1 + (long)mfc);
    ps = (char *)__ckd_calloc__((size_t)mfc,1,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                                ,0x4cc);
    while( true ) {
      iVar1 = snprintf(ps,(size_t)mfc,"%s%s%s%s",cepext_local,_nfr,dir_local,_ef_local);
      cepext_length = (size_t)iVar1;
      if (cepext_length <= mfc) break;
      mfc = (mfcc_t **)cepext_length;
      ps = (char *)__ckd_realloc__(ps,cepext_length,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                                   ,0x4d4);
    }
    file_length._4_4_ = *(int *)(file_local + 0x20);
    if (-1 < maxfr) {
      maxfr = file_length._4_4_ * 2 + maxfr;
    }
    if (feat == (mfcc_t ***)0x0) {
      file_length._0_4_ =
           feat_s2mfc_read_norm_pad
                     ((feat_t *)file_local,ps,file_length._4_4_,path._4_4_,(int32)path,
                      (mfcc_t ***)0x0,maxfr,*(int32 *)(file_local + 0x10));
      ckd_free(ps);
      if ((int32)file_length < 0) {
        return (int32)file_length;
      }
    }
    else {
      file_length._0_4_ =
           feat_s2mfc_read_norm_pad
                     ((feat_t *)file_local,ps,file_length._4_4_,path._4_4_,(int32)path,&local_70,
                      maxfr,*(int32 *)(file_local + 0x10));
      ckd_free(ps);
      if ((int32)file_length < 0) {
        ckd_free_2d(local_70);
        return -1;
      }
      feat_compute_utt((feat_t *)file_local,local_70,(int32)file_length,file_length._4_4_,feat);
      ckd_free_2d(local_70);
    }
    fcb_local._4_4_ = (int32)file_length + file_length._4_4_ * -2;
  }
  return fcb_local._4_4_;
}

Assistant:

int32
feat_s2mfc2feat(feat_t * fcb, const char *file, const char *dir, const char *cepext,
                int32 sf, int32 ef, mfcc_t *** feat, int32 maxfr)
{
    char *path;
    char *ps = "/";
    int32 win, nfr;
    size_t file_length, cepext_length, path_length = 0;
    mfcc_t **mfc;

    if (fcb->cepsize <= 0) {
        E_ERROR("Bad cepsize: %d\n", fcb->cepsize);
        return -1;
    }

    if (cepext == NULL)
        cepext = "";

    /*
     * Create mfc filename, combining file, dir and extension if
     * necessary
     */

    /*
     * First we decide about the path. If dir is defined, then use
     * it. Otherwise assume the filename already contains the path.
     */
    if (dir == NULL) {
        dir = "";
        ps = "";
        /*
         * This is not true but some 3rd party apps
         * may parse the output explicitly checking for this line
         */
        E_INFO("At directory . (current directory)\n");
    }
    else {
        E_INFO("At directory %s\n", dir);
        /*
         * Do not forget the path separator!
         */
        path_length += strlen(dir) + 1;
    }

    /*
     * Include cepext, if it's not already part of the filename.
     */
    file_length = strlen(file);
    cepext_length = strlen(cepext);
    if ((file_length > cepext_length)
        && (strcmp(file + file_length - cepext_length, cepext) == 0)) {
        cepext = "";
        cepext_length = 0;
    }

    /*
     * Do not forget the '\0'
     */
    path_length += file_length + cepext_length + 1;
    path = (char*) ckd_calloc(path_length, sizeof(char));

#ifdef HAVE_SNPRINTF
    /*
     * Paranoia is our best friend...
     */
    while ((file_length = snprintf(path, path_length, "%s%s%s%s", dir, ps, file, cepext)) > path_length) {
        path_length = file_length;
        path = (char*) ckd_realloc(path, path_length * sizeof(char));
    }
#else
    sprintf(path, "%s%s%s%s", dir, ps, file, cepext);
#endif

    win = feat_window_size(fcb);
    /* Pad maxfr with win, so we read enough raw feature data to
     * calculate the requisite number of dynamic features. */
    if (maxfr >= 0)
        maxfr += win * 2;

    if (feat != NULL) {
        /* Read mfc file including window or padding if necessary. */
        nfr = feat_s2mfc_read_norm_pad(fcb, path, win, sf, ef, &mfc, maxfr, fcb->cepsize);
        ckd_free(path);
        if (nfr < 0) {
            ckd_free_2d((void **) mfc);
            return -1;
        }

        /* Actually compute the features */
        feat_compute_utt(fcb, mfc, nfr, win, feat);
        
        ckd_free_2d((void **) mfc);
    }
    else {
        /* Just calculate the number of frames we would need. */
        nfr = feat_s2mfc_read_norm_pad(fcb, path, win, sf, ef, NULL, maxfr, fcb->cepsize);
        ckd_free(path);
        if (nfr < 0)
            return nfr;
    }


    return (nfr - win * 2);
}